

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

string * duckdb::Base64Decode(string *__return_storage_ptr__,string *key)

{
  data_ptr_t output_00;
  uchar *puVar1;
  undefined8 extraout_RDX;
  idx_t in_R8;
  string_t str;
  string_t str_00;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>,_true> output;
  _Head_base<0UL,_unsigned_char_*,_false> local_48;
  anon_union_16_2_67f50693_for_value local_40;
  anon_union_16_2_67f50693_for_value local_30;
  
  string_t::string_t((string_t *)&local_30.pointer,key);
  str.value.pointer.ptr = (char *)extraout_RDX;
  str.value._0_8_ = local_30.pointer.ptr;
  output_00 = (data_ptr_t)Blob::FromBase64Size((Blob *)local_30._0_8_,str);
  puVar1 = (uchar *)operator_new__((ulong)output_00);
  local_48._M_head_impl = puVar1;
  string_t::string_t((string_t *)&local_40.pointer,key);
  str_00.value.pointer.ptr = (char *)puVar1;
  str_00.value._0_8_ = local_40.pointer.ptr;
  Blob::FromBase64((Blob *)local_40._0_8_,str_00,output_00,in_R8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_48._M_head_impl,
             output_00 + (long)local_48._M_head_impl);
  ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string Base64Decode(const string &key) {
	auto result_size = Blob::FromBase64Size(key);
	auto output = duckdb::unique_ptr<unsigned char[]>(new unsigned char[result_size]);
	Blob::FromBase64(key, output.get(), result_size);
	string decoded_key(reinterpret_cast<const char *>(output.get()), result_size);
	return decoded_key;
}